

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O0

bool __thiscall BufferedReader::seek(BufferedReader *this,int readerID,int64_t offset)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  ReaderData *data;
  _Self local_30;
  iterator itr;
  int64_t offset_local;
  BufferedReader *pBStack_18;
  int readerID_local;
  BufferedReader *this_local;
  
  itr._M_node = (_Base_ptr)offset;
  offset_local._4_4_ = readerID;
  pBStack_18 = this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
       ::find(&this->m_readers,(key_type_conflict *)((long)&offset_local + 4));
  data = (ReaderData *)
         std::
         map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
         ::end(&this->m_readers);
  bVar1 = std::operator!=(&local_30,(_Self *)&data);
  if (bVar1) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_ReaderData_*>_>::operator->(&local_30);
    iVar2 = (*ppVar3->second->_vptr_ReaderData[2])(ppVar3->second,itr._M_node);
    this_local._7_1_ = (bool)((byte)iVar2 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BufferedReader::seek(const int readerID, const int64_t offset)
{
    const auto itr = m_readers.find(readerID);
    if (itr != m_readers.end())
    {
        ReaderData* data = itr->second;
        return data->incSeek(offset);
    }
    return false;
}